

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexchange.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *ppBVar1;
  pointer *pppLVar2;
  iterator __position;
  int iVar3;
  bool bVar4;
  int iVar5;
  QueuePolicy *q_policy;
  time_t tVar6;
  Link *l;
  undefined4 *b;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  string_view format_str;
  format_args args;
  BlockID neighbor;
  vector<int,_std::allocator<int>_> gids;
  RoundRobinAssigner assigner;
  communicator world;
  code *local_1868 [2];
  code *local_1858;
  code *local_1850;
  communicator local_1848;
  LoadBlock local_1830;
  SaveBlock local_1810;
  DestroyBlock local_17f0;
  CreateBlock local_17d0;
  environment env;
  _Any_data local_17a8;
  code *local_1798;
  code *local_1790;
  _Any_data local_1788;
  code *local_1778;
  code *local_1770;
  _Any_data local_1768;
  code *local_1758;
  code *local_1750;
  _Any_data local_1748;
  code *local_1738;
  code *local_1730;
  _Any_data local_1728;
  code *local_1718;
  code *local_1710;
  _Any_data local_1708;
  code *local_16f8;
  code *local_16f0;
  FileStorage storage;
  Master master;
  
  storage.super_ExternalStorage._vptr_ExternalStorage._0_4_ = argc;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)argv;
  MPI_Init_thread(&storage,&master,1,&env);
  world.comm_.data = (MPI_Comm)&ompi_mpi_comm_world;
  world.rank_ = 0;
  world.size_ = 1;
  world.owner_ = false;
  MPI_Comm_rank();
  MPI_Comm_size(world.comm_.data);
  pppLVar2 = &master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pppLVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&master,"./DIY.XXXXXX","");
  storage.super_ExternalStorage._vptr_ExternalStorage = (_func_int **)&PTR_put_0013d598;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&storage.filename_templates_,1,(value_type *)&master,(allocator_type *)&neighbor);
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  storage.filenames_.m_.mLock = 0;
  storage.max_size_.x_ = 0;
  storage.max_size_.m_.mLock = 0;
  storage.count_.x_ = 0;
  storage.count_.m_.mLock = 0;
  storage.current_size_.x_ = 0;
  storage.current_size_.m_.mLock = 0;
  storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       storage.filenames_.x_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)pppLVar2) {
    operator_delete(master.links_.super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)master.links_.
                          super__Vector_base<diy::Link_*,_std::allocator<diy::Link_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  iVar3 = world.size_;
  local_1848.comm_.data = world.comm_.data;
  local_1848.rank_ = world.rank_;
  local_1848.size_ = world.size_;
  local_1848.owner_ = false;
  local_17d0.super__Function_base._M_functor._8_8_ = 0;
  local_17d0.super__Function_base._M_functor._M_unused._M_object = create_block;
  local_17d0._M_invoker = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
  local_17d0.super__Function_base._M_manager =
       std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
  local_17f0.super__Function_base._M_functor._8_8_ = 0;
  local_17f0.super__Function_base._M_functor._M_unused._M_object = destroy_block;
  local_17f0._M_invoker = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
  local_17f0.super__Function_base._M_manager =
       std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
  local_1810.super__Function_base._M_functor._8_8_ = 0;
  local_1810.super__Function_base._M_functor._M_unused._M_object = save_block;
  local_1810._M_invoker =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_1810.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  local_1830.super__Function_base._M_functor._8_8_ = 0;
  local_1830.super__Function_base._M_functor._M_unused._M_object = load_block;
  local_1830._M_invoker =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_invoke;
  local_1830.super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
       ::_M_manager;
  q_policy = (QueuePolicy *)operator_new(0x10);
  q_policy->_vptr_QueuePolicy = (_func_int **)&PTR_unload_incoming_0013d6f0;
  q_policy[1]._vptr_QueuePolicy = (_func_int **)0x1000;
  diy::Master::Master(&master,&local_1848,2,-1,&local_17d0,&local_17f0,
                      &storage.super_ExternalStorage,&local_1810,&local_1830,q_policy);
  if (local_1830.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1830.super__Function_base._M_manager)
              ((_Any_data *)&local_1830,(_Any_data *)&local_1830,__destroy_functor);
  }
  if (local_1810.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1810.super__Function_base._M_manager)
              ((_Any_data *)&local_1810,(_Any_data *)&local_1810,__destroy_functor);
  }
  if (local_17f0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_17f0.super__Function_base._M_manager)
              ((_Any_data *)&local_17f0,(_Any_data *)&local_17f0,__destroy_functor);
  }
  if (local_17d0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_17d0.super__Function_base._M_manager)
              ((_Any_data *)&local_17d0,(_Any_data *)&local_17d0,__destroy_functor);
  }
  iVar3 = iVar3 * 0x18;
  diy::mpi::communicator::~communicator(&local_1848);
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_0013d748;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  neighbor.gid = world.rank_;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = iVar3;
  if (world.rank_ < iVar3) {
    iVar5 = world.rank_;
    do {
      if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&gids,
                   (iterator)
                   gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&neighbor.gid);
      }
      else {
        *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar5;
        gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
      }
      iVar5 = neighbor.gid + assigner.super_StaticAssigner.super_Assigner.size_;
      neighbor.gid = iVar5;
    } while (iVar5 < assigner.super_StaticAssigner.super_Assigner.nblocks_);
    if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        != gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) {
      uVar11 = 0;
      do {
        iVar5 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar11];
        l = (Link *)operator_new(0x20);
        (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__0013d7c8;
        (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (iVar5 < iVar3 + -1) {
          neighbor.proc = (iVar5 + 1) % assigner.super_StaticAssigner.super_Assigner.size_;
          neighbor.gid = iVar5 + 1;
          std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
          _M_realloc_insert<diy::BlockID_const&>
                    ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,
                     (iterator)0x0,&neighbor);
        }
        if (0 < iVar5) {
          neighbor.proc = (iVar5 + -1) % assigner.super_StaticAssigner.super_Assigner.size_;
          neighbor.gid = iVar5 + -1;
          __position._M_current =
               (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<diy::BlockID,std::allocator<diy::BlockID>>::
            _M_realloc_insert<diy::BlockID_const&>
                      ((vector<diy::BlockID,std::allocator<diy::BlockID>> *)&l->neighbors_,
                       __position,&neighbor);
          }
          else {
            *__position._M_current = neighbor;
            ppBVar1 = &(l->neighbors_).
                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppBVar1 = *ppBVar1 + 1;
          }
        }
        b = (undefined4 *)operator_new(4);
        *b = 0;
        diy::Master::add(&master,iVar5,b,l);
        uVar11 = uVar11 + 1;
      } while (uVar11 < (ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2));
    }
  }
  bVar4 = true;
  do {
    bVar12 = bVar4;
    local_1868[0] = enq;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)local_1868,(Skip *)&neighbor);
    std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
              ((_Any_data *)&neighbor,(_Any_data *)&neighbor,__destroy_functor);
    local_1748._M_unused._M_object = (void *)0x0;
    local_1748._8_8_ = 0;
    local_1730 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_1738 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_1728._M_unused._M_object = (void *)0x0;
    local_1728._8_8_ = 0;
    local_1710 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1718 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1708._M_unused._M_object = (void *)0x0;
    local_1708._8_8_ = 0;
    local_16f0 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_16f8 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,false,(MemoryManagement *)&local_1748);
    if (local_16f8 != (code *)0x0) {
      (*local_16f8)(&local_1708,&local_1708,__destroy_functor);
    }
    if (local_1718 != (code *)0x0) {
      (*local_1718)(&local_1728,&local_1728,__destroy_functor);
    }
    if (local_1738 != (code *)0x0) {
      (*local_1738)(&local_1748,&local_1748,__destroy_functor);
    }
    local_1868[0] = deq;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)local_1868,(Skip *)&neighbor);
    std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
              ((_Any_data *)&neighbor,(_Any_data *)&neighbor,__destroy_functor);
    local_1868[0] = (code *)0x0;
    local_1868[1] = (code *)0x0;
    local_1850 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_invoke;
    local_1858 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
                 _M_manager;
    neighbor = (BlockID)&assigner;
    diy::Master::foreach_<Block>(&master,(Callback<Block> *)&neighbor,(Skip *)local_1868);
    std::
    _Function_handler<void_(Block_*,_const_diy::Master::ProxyWithLink_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/simple/rexchange.cpp:142:24)>
    ::_M_manager((_Any_data *)&neighbor,(_Any_data *)&neighbor,__destroy_functor);
    if (local_1858 != (code *)0x0) {
      (*local_1858)((_Any_data *)local_1868,(_Any_data *)local_1868,__destroy_functor);
    }
    local_17a8._M_unused._M_object = (void *)0x0;
    local_17a8._8_8_ = 0;
    local_1790 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_1798 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_1788._M_unused._M_object = (void *)0x0;
    local_1788._8_8_ = 0;
    local_1770 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1778 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1768._M_unused._M_object = (void *)0x0;
    local_1768._8_8_ = 0;
    local_1750 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1758 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,true,(MemoryManagement *)&local_17a8);
    if (local_1758 != (code *)0x0) {
      (*local_1758)(&local_1768,&local_1768,__destroy_functor);
    }
    if (local_1778 != (code *)0x0) {
      (*local_1778)(&local_1788,&local_1788,__destroy_functor);
    }
    if (local_1798 != (code *)0x0) {
      (*local_1798)(&local_17a8,&local_17a8,__destroy_functor);
    }
    local_1868[0] = remote_deq;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)local_1868,(Skip *)&neighbor);
    std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::_M_manager
              ((_Any_data *)&neighbor,(_Any_data *)&neighbor,__destroy_functor);
    bVar4 = false;
  } while (bVar12);
  if (world.rank_ == 0) {
    uVar11 = (ulong)((long)master.blocks_.elements_.
                           super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)master.blocks_.elements_.
                          super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3;
    uVar7 = (uint)uVar11;
    if ((int)uVar7 < 1) {
      lVar8 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar10 = uVar9;
        if (master.blocks_.elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] != (void *)0x0) break;
        uVar9 = uVar9 + 1;
        uVar10 = uVar11;
      } while ((uVar7 & 0x7fffffff) != uVar9);
      lVar8 = (long)(int)uVar10 << 3;
    }
    neighbor.proc = 0;
    neighbor.gid = **(uint **)((long)master.blocks_.elements_.
                                     super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8);
    format_str.size_ = 0x15;
    format_str.data_ = "Total iterations: {}\n";
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &neighbor;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 1;
    fmt::v7::vprint(_stderr,format_str,args);
  }
  if (gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  diy::Master::~Master(&master);
  diy::FileStorage::~FileStorage(&storage);
  diy::mpi::communicator::~communicator(&world);
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//     diy::create_logger("trace");

    diy::mpi::environment     env(argc, argv);
    diy::mpi::communicator    world;
    diy::FileStorage          storage("./DIY.XXXXXX");
    int                       nblocks    = 24 * world.size();
//     int                       threads    = 1;
    int                       threads    = 2;
    int                       mem_blocks = -1;

    diy::Master               master(world,
                                     threads,
                                     mem_blocks,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    srand(static_cast<unsigned int>(time(NULL)));

    diy::RoundRobinAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks with links between adjacent blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (size_t i = 0; i < gids.size(); ++i)   // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*   link = new diy::Link;   // link is this block's neighborhood
        diy::BlockID neighbor;               // one neighbor in the neighborhood
        if (gid < nblocks - 1)               // RH neighbors for all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // LH neighbors for all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        master.add(gid, new Block, link);    // add the current local block to the master
    }

    int num_iters = 2;
    for (int i = 0; i < num_iters; i++)
    {
        // exchange some data inside the links
        master.foreach(&enq);
        master.exchange();
        master.foreach(&deq);

        // (remote) exchange some data outside the links
        master.foreach([&](Block* b, const diy::Master::ProxyWithLink& cp)
                { remote_enq(b, cp, assigner); });
        bool remote = true;
        master.exchange(remote);
        master.foreach(&remote_deq);
    }

    if (world.rank() == 0)
        fmt::print(stderr,
                   "Total iterations: {}\n", master.block<Block>(master.loaded_block())->count);

}